

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O2

int __thiscall dit::DeutilTests::init(DeutilTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SelfCheckCase *pSVar1;
  
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"timer",
             "deTimer_selfTest()",deTimer_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"command_line",
             "deCommandLine_selfTest()",deCommandLine_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "timer",			"deTimer_selfTest()",		deTimer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "command_line",	"deCommandLine_selfTest()",	deCommandLine_selfTest));
	}